

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

shared_ptr<chrono::ChSolver> __thiscall chrono::ChSystem::GetSolver(ChSystem *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<chrono::ChSolver> sVar1;
  shared_ptr<chrono::ChIterativeSolver> iter_solver;
  shared_ptr<chrono::ChSolver> local_30;
  
  std::dynamic_pointer_cast<chrono::ChIterativeSolver,chrono::ChSolver>(&local_30);
  if ((local_30.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0) && (0.0 < *(double *)(in_RSI + 0x1c8))) {
    ((local_30.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->output_dir)
    ._M_dataplus._M_p = (pointer)(*(double *)(in_RSI + 0x1c8) * *(double *)(in_RSI + 0x1b0));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_30.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x1e8));
  sVar1.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChSolver>)
         sVar1.super___shared_ptr<chrono::ChSolver,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChSolver> ChSystem::GetSolver() {
    // In case the solver is iterative, and if the user specified a force-level tolerance,
    // overwrite the solver's tolerance threshold.
    if (auto iter_solver = std::dynamic_pointer_cast<ChIterativeSolver>(solver)) {
        if (tol_force > 0) {
            iter_solver->SetTolerance(tol_force * step);
        }
    }

    return solver;
}